

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus,REF_DBL *uplus)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  REF_DBL RVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  RVar5 = yplus;
  if (12.0 < yplus) {
    dVar4 = log(yplus / 0.1108);
    RVar5 = dVar4 / 0.4;
  }
  bVar3 = true;
  iVar1 = 100;
  do {
    if (!bVar3) {
      *uplus = RVar5;
      return 0;
    }
    dVar4 = exp(RVar5 * 0.4);
    dVar9 = (RVar5 * -0.4 + dVar4 + -1.0) * 0.1108 + RVar5;
    dVar10 = dVar9 - yplus;
    dVar4 = exp(RVar5 * 0.4);
    dVar11 = (dVar4 * 0.4 + -0.4) * 0.1108 + 1.0;
    auVar6._0_8_ = dVar9 * 1e+20;
    auVar6._8_8_ = dVar10;
    auVar7._8_8_ = -dVar10;
    auVar7._0_8_ = -auVar6._0_8_;
    auVar7 = maxpd(auVar6,auVar7);
    dVar4 = auVar7._8_8_;
    if (auVar7._0_8_ <= dVar4) {
LAB_001aaea8:
      bVar3 = dVar4 == 1e-15;
      bVar2 = dVar4 < 1e-15;
    }
    else {
      dVar8 = dVar9;
      if (dVar9 <= -dVar9) {
        dVar8 = -dVar9;
      }
      if (dVar8 <= 0.001) goto LAB_001aaea8;
      dVar4 = dVar10 / dVar9;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      bVar3 = dVar4 == 1e-12;
      bVar2 = dVar4 < 1e-12;
    }
    bVar3 = !bVar2 && !bVar3;
    RVar5 = RVar5 - dVar10 / dVar11;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2a4,
             "ref_phys_spalding_uplus","iteration count exceeded");
      printf(" y %e u %e err %e dydu %e\n",dVar9,RVar5,dVar10,dVar11);
      return 1;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus, REF_DBL *uplus) {
  REF_DBL u, y, error, dyplus_duplus;
  REF_BOOL keep_going;
  REF_INT iters;
  u = yplus;
  if (u > 12) u = log(yplus / 0.1108) / 0.4;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    RSS(ref_phys_spalding_yplus(u, &y), "yplus");
    error = y - yplus;

    RSS(ref_phys_spalding_dyplus_duplus(u, &dyplus_duplus), "dyplus");

    u = u - error / dyplus_duplus;

    if (ref_math_divisible(error, y) && ABS(y) > 1.0e-3) {
      keep_going = (ABS(error / y) > 1.0e-12);
    } else {
      keep_going = (ABS(error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded",
        { printf(" y %e u %e err %e dydu %e\n", y, u, error, dyplus_duplus); });
  }

  *uplus = u;

  return REF_SUCCESS;
}